

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O2

void __thiscall ser::MetainfoSet::AddNode(MetainfoSet *this,JSONNode *node)

{
  uchar uVar1;
  exception eVar2;
  ostream *poVar3;
  SerializationException *this_00;
  int iVar4;
  double r;
  SerializationException exception;
  json_string local_1c0;
  ostringstream ss;
  
  uVar1 = node->internal->_type;
  if (uVar1 == '\x01') {
    ::JSONNode::name_abi_cxx11_((json_string *)&ss,node);
    ::JSONNode::as_string_abi_cxx11_((json_string *)&exception,node);
    AddMetainfo<std::__cxx11::string>
              (this,(json_string *)&ss,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exception);
    std::__cxx11::string::~string((string *)&exception);
  }
  else if (uVar1 == '\x02') {
    r = ::JSONNode::as_float(node);
    if ((r != (double)(int)r) || (NAN(r) || NAN((double)(int)r))) {
      ::JSONNode::name_abi_cxx11_((json_string *)&ss,node);
      AddMetainfo<double>(this,(json_string *)&ss,&r);
    }
    else {
      iVar4 = (int)r;
      ::JSONNode::name_abi_cxx11_((json_string *)&ss,node);
      exception._0_4_ = iVar4;
      AddMetainfo<int>(this,(json_string *)&ss,(int *)&exception);
    }
  }
  else {
    if (uVar1 != '\x03') {
      exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
      exception._0_8_ = &PTR__SerializationException_0013e790;
      exception.message_._M_string_length = 0;
      exception.message_.field_2._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar3 = std::operator<<((ostream *)&ss,
                               "Error: JSON node has wrong type and could not be parsed:\n");
      ::JSONNode::write_formatted_abi_cxx11_(&local_1c0,node,0x800);
      poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&exception.message_);
      std::__cxx11::string::~string((string *)&local_1c0);
      this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
      SerializationException::SerializationException(this_00,&exception);
      __cxa_throw(this_00,&SerializationException::typeinfo,
                  SerializationException::~SerializationException);
    }
    ::JSONNode::name_abi_cxx11_((json_string *)&ss,node);
    eVar2 = (exception)::JSONNode::as_bool(node);
    exception.super_exception = eVar2;
    AddMetainfo<bool>(this,(json_string *)&ss,(bool *)&exception);
  }
  std::__cxx11::string::~string((string *)&ss);
  return;
}

Assistant:

void MetainfoSet::AddNode(const JSONNode& node)
{
    JSON_NUMBER_TYPE r;
    switch (node.type())
    {
    case JSON_BOOL:
        return AddMetainfo(node.name(), node.as_bool());
    case JSON_STRING:
        return AddMetainfo(node.name(), node.as_string());
    case JSON_NUMBER:
        r = node.as_float();
        if (r == static_cast<JSON_NUMBER_TYPE>(static_cast<int>(r)))
            return AddMetainfo(node.name(), static_cast<int>(r));
        else
            return AddMetainfo(node.name(), r);
    default:
        break;
    }

    SerializationException exception;
    std::ostringstream ss;
    ss << "Error: JSON node has wrong type and could not be parsed:\n" << node.write_formatted() << "\n";
    exception.Init(ss.str());
    throw exception;
}